

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProxyClient.cpp
# Opt level: O2

bool __thiscall ProxyClient::start(ProxyClient *this)

{
  UVLoop *this_00;
  _Head_base<0UL,_net_uv::TCPServer_*,_false> _Var1;
  Cypher *pCVar2;
  Client *pCVar3;
  undefined8 uVar4;
  bool bVar5;
  bool bVar6;
  char cVar7;
  uint32_t uVar8;
  uint32_t uVar9;
  ProxyConfig *this_01;
  uv_loop_t *loop;
  int __fd;
  bool bVar10;
  _Any_data local_108;
  code *local_f8;
  code *local_f0;
  char local_e1;
  uint32_t local_e0;
  undefined4 local_dc;
  size_type local_d8;
  string local_d0;
  string encryKey;
  string remoteIP;
  string localIP;
  string encryMethod;
  
  if (this->m_runStatus != STOP) {
    __assert_fail("m_runStatus == RUN_STATUS::STOP",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/tkzcfc[P]vpn_uv/common/ProxyClient.cpp"
                  ,0x18,"bool ProxyClient::start()");
  }
  this_01 = ProxyConfig::getInstance();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&encryKey,"",(allocator<char> *)&localIP);
  ProxyConfig::getString(&encryMethod,this_01,"encry_method",&encryKey);
  std::__cxx11::string::~string((string *)&encryKey);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&localIP,"",(allocator<char> *)&remoteIP);
  ProxyConfig::getString(&encryKey,this_01,"encry_key",&localIP);
  std::__cxx11::string::~string((string *)&localIP);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&remoteIP,"",(allocator<char> *)local_108._M_pod_data);
  ProxyConfig::getString(&localIP,this_01,"client_listenIP",&remoteIP);
  std::__cxx11::string::~string((string *)&remoteIP);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_108._M_pod_data,"",(allocator<char> *)&local_d0);
  ProxyConfig::getString(&remoteIP,this_01,"remoteIP",(string *)&local_108);
  std::__cxx11::string::~string((string *)local_108._M_pod_data);
  local_e0 = ProxyConfig::getUInt32(this_01,"client_listenPort",0);
  uVar8 = ProxyConfig::getUInt32(this_01,"svr_listenPort",0);
  uVar9 = ProxyConfig::getUInt32(this_01,"client_listenCount",0xffff);
  bVar5 = ProxyConfig::getBool(this_01,"is_ipv6",false);
  local_e1 = ProxyConfig::getBool(this_01,"use_kcp",false);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d0,"",(allocator<char> *)&local_d8);
  ProxyConfig::getString((string *)&local_108,this_01,"username",&local_d0);
  std::__cxx11::string::operator=((string *)&this->m_username,(string *)local_108._M_pod_data);
  std::__cxx11::string::~string((string *)local_108._M_pod_data);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d0,"",(allocator<char> *)&local_d8);
  ProxyConfig::getString((string *)&local_108,this_01,"password",&local_d0);
  std::__cxx11::string::operator=((string *)&this->m_password,(string *)local_108._M_pod_data);
  std::__cxx11::string::~string((string *)local_108._M_pod_data);
  std::__cxx11::string::~string((string *)&local_d0);
  bVar6 = std::operator==(&encryMethod,"RC4");
  if ((!bVar6) || (encryKey._M_string_length != 0)) {
    bVar10 = false;
    bVar6 = false;
    if (((local_e0 == 0) ||
        (((bVar6 = bVar10, uVar8 == 0 || (uVar9 == 0)) || (localIP._M_string_length == 0)))) ||
       (remoteIP._M_string_length == 0)) goto LAB_00131a99;
    std::__cxx11::string::_M_assign((string *)&this->m_remoteIP);
    this->m_remotePort = uVar8;
    std::make_unique<net_uv::TCPServer>();
    uVar4 = local_108._M_unused._0_8_;
    local_108._M_unused._M_object = (TCPServer *)0x0;
    _Var1._M_head_impl =
         (this->m_tcpSvr)._M_t.
         super___uniq_ptr_impl<net_uv::TCPServer,_std::default_delete<net_uv::TCPServer>_>._M_t.
         super__Tuple_impl<0UL,_net_uv::TCPServer_*,_std::default_delete<net_uv::TCPServer>_>.
         super__Head_base<0UL,_net_uv::TCPServer_*,_false>._M_head_impl;
    (this->m_tcpSvr)._M_t.
    super___uniq_ptr_impl<net_uv::TCPServer,_std::default_delete<net_uv::TCPServer>_>._M_t.
    super__Tuple_impl<0UL,_net_uv::TCPServer_*,_std::default_delete<net_uv::TCPServer>_>.
    super__Head_base<0UL,_net_uv::TCPServer_*,_false>._M_head_impl = (TCPServer *)uVar4;
    if (_Var1._M_head_impl != (TCPServer *)0x0) {
      (**(code **)(*(long *)&(_Var1._M_head_impl)->super_Server + 8))();
      if ((TCPServer *)local_108._M_unused._0_8_ != (TCPServer *)0x0) {
        (**(code **)(*local_108._M_unused._M_object + 8))();
      }
    }
    _Var1._M_head_impl =
         (this->m_tcpSvr)._M_t.
         super___uniq_ptr_impl<net_uv::TCPServer,_std::default_delete<net_uv::TCPServer>_>._M_t.
         super__Tuple_impl<0UL,_net_uv::TCPServer_*,_std::default_delete<net_uv::TCPServer>_>.
         super__Head_base<0UL,_net_uv::TCPServer_*,_false>._M_head_impl;
    local_d0._M_dataplus._M_p = (pointer)on_tcp_ServerCloseCall;
    local_d0._M_string_length = 0;
    local_d0.field_2._M_allocated_capacity = (size_type)this;
    std::function<void(net_uv::Server*)>::
    function<std::_Bind<void(ProxyClient::*(ProxyClient*,std::_Placeholder<1>))(net_uv::Server*)>,void>
              ((function<void(net_uv::Server*)> *)local_108._M_pod_data,
               (_Bind<void_(ProxyClient::*(ProxyClient_*,_std::_Placeholder<1>))(net_uv::Server_*)>
                *)&local_d0);
    std::function<void_(net_uv::Server_*)>::operator=
              (&((_Var1._M_head_impl)->super_Server).m_closeCall,
               (function<void_(net_uv::Server_*)> *)&local_108);
    std::_Function_base::~_Function_base((_Function_base *)&local_108);
    _Var1._M_head_impl =
         (this->m_tcpSvr)._M_t.
         super___uniq_ptr_impl<net_uv::TCPServer,_std::default_delete<net_uv::TCPServer>_>._M_t.
         super__Tuple_impl<0UL,_net_uv::TCPServer_*,_std::default_delete<net_uv::TCPServer>_>.
         super__Head_base<0UL,_net_uv::TCPServer_*,_false>._M_head_impl;
    local_d0._M_dataplus._M_p = (pointer)on_tcp_ServerNewConnectCall;
    local_d0._M_string_length = 0;
    local_d0.field_2._M_allocated_capacity = (size_type)this;
    std::function<void(net_uv::Server*,net_uv::Session*)>::
    function<std::_Bind<void(ProxyClient::*(ProxyClient*,std::_Placeholder<1>,std::_Placeholder<2>))(net_uv::Server*,net_uv::Session*)>,void>
              ((function<void(net_uv::Server*,net_uv::Session*)> *)local_108._M_pod_data,
               (_Bind<void_(ProxyClient::*(ProxyClient_*,_std::_Placeholder<1>,_std::_Placeholder<2>))(net_uv::Server_*,_net_uv::Session_*)>
                *)&local_d0);
    std::function<void_(net_uv::Server_*,_net_uv::Session_*)>::operator=
              (&((_Var1._M_head_impl)->super_Server).m_newConnectCall,
               (function<void_(net_uv::Server_*,_net_uv::Session_*)> *)&local_108);
    std::_Function_base::~_Function_base((_Function_base *)&local_108);
    _Var1._M_head_impl =
         (this->m_tcpSvr)._M_t.
         super___uniq_ptr_impl<net_uv::TCPServer,_std::default_delete<net_uv::TCPServer>_>._M_t.
         super__Tuple_impl<0UL,_net_uv::TCPServer_*,_std::default_delete<net_uv::TCPServer>_>.
         super__Head_base<0UL,_net_uv::TCPServer_*,_false>._M_head_impl;
    local_d0._M_dataplus._M_p = (pointer)on_tcp_ServerRecvCall;
    local_d0._M_string_length = 0;
    local_d0.field_2._M_allocated_capacity = (size_type)this;
    std::function<void(net_uv::Server*,net_uv::Session*,char*,unsigned_int)>::
    function<std::_Bind<void(ProxyClient::*(ProxyClient*,std::_Placeholder<1>,std::_Placeholder<2>,std::_Placeholder<3>,std::_Placeholder<4>))(net_uv::Server*,net_uv::Session*,char*,unsigned_int)>,void>
              ((function<void(net_uv::Server*,net_uv::Session*,char*,unsigned_int)> *)
               local_108._M_pod_data,
               (_Bind<void_(ProxyClient::*(ProxyClient_*,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::_Placeholder<3>,_std::_Placeholder<4>))(net_uv::Server_*,_net_uv::Session_*,_char_*,_unsigned_int)>
                *)&local_d0);
    std::function<void_(net_uv::Server_*,_net_uv::Session_*,_char_*,_unsigned_int)>::operator=
              (&((_Var1._M_head_impl)->super_Server).m_recvCall,
               (function<void_(net_uv::Server_*,_net_uv::Session_*,_char_*,_unsigned_int)> *)
               &local_108);
    std::_Function_base::~_Function_base((_Function_base *)&local_108);
    _Var1._M_head_impl =
         (this->m_tcpSvr)._M_t.
         super___uniq_ptr_impl<net_uv::TCPServer,_std::default_delete<net_uv::TCPServer>_>._M_t.
         super__Tuple_impl<0UL,_net_uv::TCPServer_*,_std::default_delete<net_uv::TCPServer>_>.
         super__Head_base<0UL,_net_uv::TCPServer_*,_false>._M_head_impl;
    local_d0._M_dataplus._M_p = (pointer)on_tcp_ServerDisconnectCall;
    local_d0._M_string_length = 0;
    local_d0.field_2._M_allocated_capacity = (size_type)this;
    std::function<void(net_uv::Server*,net_uv::Session*)>::
    function<std::_Bind<void(ProxyClient::*(ProxyClient*,std::_Placeholder<1>,std::_Placeholder<2>))(net_uv::Server*,net_uv::Session*)>,void>
              ((function<void(net_uv::Server*,net_uv::Session*)> *)local_108._M_pod_data,
               (_Bind<void_(ProxyClient::*(ProxyClient_*,_std::_Placeholder<1>,_std::_Placeholder<2>))(net_uv::Server_*,_net_uv::Session_*)>
                *)&local_d0);
    std::function<void_(net_uv::Server_*,_net_uv::Session_*)>::operator=
              (&((_Var1._M_head_impl)->super_Server).m_disconnectCall,
               (function<void_(net_uv::Server_*,_net_uv::Session_*)> *)&local_108);
    std::_Function_base::~_Function_base((_Function_base *)&local_108);
    _Var1._M_head_impl =
         (this->m_tcpSvr)._M_t.
         super___uniq_ptr_impl<net_uv::TCPServer,_std::default_delete<net_uv::TCPServer>_>._M_t.
         super__Tuple_impl<0UL,_net_uv::TCPServer_*,_std::default_delete<net_uv::TCPServer>_>.
         super__Head_base<0UL,_net_uv::TCPServer_*,_false>._M_head_impl;
    cVar7 = (**(code **)(*(long *)&(_Var1._M_head_impl)->super_Server + 0x30))
                      (_Var1._M_head_impl,localIP._M_dataplus._M_p,local_e0,bVar5,uVar9);
    if (cVar7 != '\0') {
      bVar5 = std::operator==(&encryMethod,"RC4");
      if (bVar5) {
        local_dc = 2;
        local_d0._M_dataplus._M_p = encryKey._M_dataplus._M_p;
        local_d8 = encryKey._M_string_length;
        std::make_unique<Cypher,EncryMethod,char_const*,unsigned_long>
                  ((EncryMethod *)local_108._M_pod_data,(char **)&local_dc,
                   (unsigned_long *)&local_d0);
      }
      else {
        bVar5 = std::operator==(&encryMethod,"SNAPPY");
        if (bVar5) {
          local_dc = 3;
          local_d0._M_dataplus._M_p = encryKey._M_dataplus._M_p;
          local_d8 = encryKey._M_string_length;
          std::make_unique<Cypher,EncryMethod,char_const*,unsigned_long>
                    ((EncryMethod *)local_108._M_pod_data,(char **)&local_dc,
                     (unsigned_long *)&local_d0);
        }
        else {
          local_dc = 1;
          local_d0._M_dataplus._M_p = encryKey._M_dataplus._M_p;
          local_d8 = encryKey._M_string_length;
          std::make_unique<Cypher,EncryMethod,char_const*,unsigned_long>
                    ((EncryMethod *)local_108._M_pod_data,(char **)&local_dc,
                     (unsigned_long *)&local_d0);
        }
      }
      uVar4 = local_108._M_unused._0_8_;
      local_108._M_unused._M_object = (Client *)0x0;
      pCVar2 = (this->m_cypher)._M_t.super___uniq_ptr_impl<Cypher,_std::default_delete<Cypher>_>.
               _M_t.super__Tuple_impl<0UL,_Cypher_*,_std::default_delete<Cypher>_>.
               super__Head_base<0UL,_Cypher_*,_false>._M_head_impl;
      (this->m_cypher)._M_t.super___uniq_ptr_impl<Cypher,_std::default_delete<Cypher>_>._M_t.
      super__Tuple_impl<0UL,_Cypher_*,_std::default_delete<Cypher>_>.
      super__Head_base<0UL,_Cypher_*,_false>._M_head_impl = (Cypher *)uVar4;
      if (pCVar2 != (Cypher *)0x0) {
        (*pCVar2->_vptr_Cypher[1])();
        if ((Client *)local_108._M_unused._0_8_ != (Client *)0x0) {
          (**(code **)(*local_108._M_unused._M_object + 8))();
        }
      }
      if (local_e1 == '\0') {
        std::make_unique<net_uv::TCPClient>();
      }
      else {
        std::make_unique<net_uv::KCPClient>();
      }
      uVar4 = local_108._M_unused._0_8_;
      local_108._M_unused._M_object = (long *)0x0;
      pCVar3 = (this->m_pipe)._M_t.
               super___uniq_ptr_impl<net_uv::Client,_std::default_delete<net_uv::Client>_>._M_t.
               super__Tuple_impl<0UL,_net_uv::Client_*,_std::default_delete<net_uv::Client>_>.
               super__Head_base<0UL,_net_uv::Client_*,_false>._M_head_impl;
      (this->m_pipe)._M_t.
      super___uniq_ptr_impl<net_uv::Client,_std::default_delete<net_uv::Client>_>._M_t.
      super__Tuple_impl<0UL,_net_uv::Client_*,_std::default_delete<net_uv::Client>_>.
      super__Head_base<0UL,_net_uv::Client_*,_false>._M_head_impl = (Client *)uVar4;
      if (pCVar3 != (Client *)0x0) {
        (**(code **)((long)(pCVar3->super_Runnable)._vptr_Runnable + 8))();
        if ((long *)local_108._M_unused._0_8_ != (long *)0x0) {
          (**(code **)(*local_108._M_unused._M_object + 8))();
        }
      }
      local_108._M_unused._M_object = (void *)0x0;
      local_108._8_8_ = 0;
      local_f0 = std::
                 _Function_handler<void_(net_uv::Client_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/tkzcfc[P]vpn_uv/common/ProxyClient.cpp:74:33)>
                 ::_M_invoke;
      local_f8 = std::
                 _Function_handler<void_(net_uv::Client_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/tkzcfc[P]vpn_uv/common/ProxyClient.cpp:74:33)>
                 ::_M_manager;
      std::function<void_(net_uv::Client_*)>::operator=
                (&((this->m_pipe)._M_t.
                   super___uniq_ptr_impl<net_uv::Client,_std::default_delete<net_uv::Client>_>._M_t.
                   super__Tuple_impl<0UL,_net_uv::Client_*,_std::default_delete<net_uv::Client>_>.
                   super__Head_base<0UL,_net_uv::Client_*,_false>._M_head_impl)->m_clientCloseCall,
                 (function<void_(net_uv::Client_*)> *)&local_108);
      std::_Function_base::~_Function_base((_Function_base *)&local_108);
      pCVar3 = (this->m_pipe)._M_t.
               super___uniq_ptr_impl<net_uv::Client,_std::default_delete<net_uv::Client>_>._M_t.
               super__Tuple_impl<0UL,_net_uv::Client_*,_std::default_delete<net_uv::Client>_>.
               super__Head_base<0UL,_net_uv::Client_*,_false>._M_head_impl;
      local_d0._M_dataplus._M_p = (pointer)on_pipeConnectCallback;
      local_d0._M_string_length = 0;
      local_d0.field_2._M_allocated_capacity = (size_type)this;
      std::function<void(net_uv::Client*,net_uv::Session*,int)>::
      function<std::_Bind<void(ProxyClient::*(ProxyClient*,std::_Placeholder<1>,std::_Placeholder<2>,std::_Placeholder<3>))(net_uv::Client*,net_uv::Session*,int)>,void>
                ((function<void(net_uv::Client*,net_uv::Session*,int)> *)local_108._M_pod_data,
                 (_Bind<void_(ProxyClient::*(ProxyClient_*,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::_Placeholder<3>))(net_uv::Client_*,_net_uv::Session_*,_int)>
                  *)&local_d0);
      std::function<void_(net_uv::Client_*,_net_uv::Session_*,_int)>::operator=
                (&pCVar3->m_connectCall,
                 (function<void_(net_uv::Client_*,_net_uv::Session_*,_int)> *)&local_108);
      std::_Function_base::~_Function_base((_Function_base *)&local_108);
      pCVar3 = (this->m_pipe)._M_t.
               super___uniq_ptr_impl<net_uv::Client,_std::default_delete<net_uv::Client>_>._M_t.
               super__Tuple_impl<0UL,_net_uv::Client_*,_std::default_delete<net_uv::Client>_>.
               super__Head_base<0UL,_net_uv::Client_*,_false>._M_head_impl;
      local_d0._M_dataplus._M_p = (pointer)on_pipeDisconnectCallback;
      local_d0._M_string_length = 0;
      local_d0.field_2._M_allocated_capacity = (size_type)this;
      std::function<void(net_uv::Client*,net_uv::Session*)>::
      function<std::_Bind<void(ProxyClient::*(ProxyClient*,std::_Placeholder<1>,std::_Placeholder<2>))(net_uv::Client*,net_uv::Session*)>,void>
                ((function<void(net_uv::Client*,net_uv::Session*)> *)local_108._M_pod_data,
                 (_Bind<void_(ProxyClient::*(ProxyClient_*,_std::_Placeholder<1>,_std::_Placeholder<2>))(net_uv::Client_*,_net_uv::Session_*)>
                  *)&local_d0);
      std::function<void_(net_uv::Client_*,_net_uv::Session_*)>::operator=
                (&pCVar3->m_disconnectCall,
                 (function<void_(net_uv::Client_*,_net_uv::Session_*)> *)&local_108);
      std::_Function_base::~_Function_base((_Function_base *)&local_108);
      pCVar3 = (this->m_pipe)._M_t.
               super___uniq_ptr_impl<net_uv::Client,_std::default_delete<net_uv::Client>_>._M_t.
               super__Tuple_impl<0UL,_net_uv::Client_*,_std::default_delete<net_uv::Client>_>.
               super__Head_base<0UL,_net_uv::Client_*,_false>._M_head_impl;
      local_d0._M_dataplus._M_p = (pointer)on_pipeRecvCallback;
      local_d0._M_string_length = 0;
      local_d0.field_2._M_allocated_capacity = (size_type)this;
      std::function<void(net_uv::Client*,net_uv::Session*,char*,unsigned_int)>::
      function<std::_Bind<void(ProxyClient::*(ProxyClient*,std::_Placeholder<1>,std::_Placeholder<2>,std::_Placeholder<3>,std::_Placeholder<4>))(net_uv::Client*,net_uv::Session*,char*,unsigned_int)>,void>
                ((function<void(net_uv::Client*,net_uv::Session*,char*,unsigned_int)> *)
                 local_108._M_pod_data,
                 (_Bind<void_(ProxyClient::*(ProxyClient_*,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::_Placeholder<3>,_std::_Placeholder<4>))(net_uv::Client_*,_net_uv::Session_*,_char_*,_unsigned_int)>
                  *)&local_d0);
      std::function<void_(net_uv::Client_*,_net_uv::Session_*,_char_*,_unsigned_int)>::operator=
                (&pCVar3->m_recvCall,
                 (function<void_(net_uv::Client_*,_net_uv::Session_*,_char_*,_unsigned_int)> *)
                 &local_108);
      std::_Function_base::~_Function_base((_Function_base *)&local_108);
      local_108._M_unused._M_object = (TCPServer *)0x0;
      local_108._8_8_ = 0;
      local_f0 = std::
                 _Function_handler<void_(net_uv::Client_*,_net_uv::Session_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/tkzcfc[P]vpn_uv/common/ProxyClient.cpp:78:35)>
                 ::_M_invoke;
      local_f8 = std::
                 _Function_handler<void_(net_uv::Client_*,_net_uv::Session_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/tkzcfc[P]vpn_uv/common/ProxyClient.cpp:78:35)>
                 ::_M_manager;
      std::function<void_(net_uv::Client_*,_net_uv::Session_*)>::operator=
                (&((this->m_pipe)._M_t.
                   super___uniq_ptr_impl<net_uv::Client,_std::default_delete<net_uv::Client>_>._M_t.
                   super__Tuple_impl<0UL,_net_uv::Client_*,_std::default_delete<net_uv::Client>_>.
                   super__Head_base<0UL,_net_uv::Client_*,_false>._M_head_impl)->m_removeSessionCall
                 ,(function<void_(net_uv::Client_*,_net_uv::Session_*)> *)&local_108);
      std::_Function_base::~_Function_base((_Function_base *)&local_108);
      this->m_runStatus = RUN;
      this_00 = &this->m_loop;
      loop = net_uv::UVLoop::ptr(this_00);
      net_uv::UVTimer::start(&this->m_update,loop,start::anon_class_1_0_00000001::__invoke,1,1,this)
      ;
      __fd = 0;
      net_uv::UVLoop::run(this_00,UV_RUN_DEFAULT);
      net_uv::UVLoop::close(this_00,__fd);
      bVar6 = true;
      if ((this->m_stopCall).super__Function_base._M_manager != (_Manager_type)0x0) {
        std::function<void_()>::operator()(&this->m_stopCall);
        std::function<void_()>::operator=(&this->m_stopCall,(nullptr_t)0x0);
      }
      goto LAB_00131a99;
    }
    _Var1._M_head_impl =
         (this->m_tcpSvr)._M_t.
         super___uniq_ptr_impl<net_uv::TCPServer,_std::default_delete<net_uv::TCPServer>_>._M_t.
         super__Tuple_impl<0UL,_net_uv::TCPServer_*,_std::default_delete<net_uv::TCPServer>_>.
         super__Head_base<0UL,_net_uv::TCPServer_*,_false>._M_head_impl;
    (this->m_tcpSvr)._M_t.
    super___uniq_ptr_impl<net_uv::TCPServer,_std::default_delete<net_uv::TCPServer>_>._M_t.
    super__Tuple_impl<0UL,_net_uv::TCPServer_*,_std::default_delete<net_uv::TCPServer>_>.
    super__Head_base<0UL,_net_uv::TCPServer_*,_false>._M_head_impl = (TCPServer *)0x0;
    if (_Var1._M_head_impl != (TCPServer *)0x0) {
      (**(code **)(*(long *)&(_Var1._M_head_impl)->super_Server + 8))();
    }
  }
  bVar6 = false;
LAB_00131a99:
  std::__cxx11::string::~string((string *)&remoteIP);
  std::__cxx11::string::~string((string *)&localIP);
  std::__cxx11::string::~string((string *)&encryKey);
  std::__cxx11::string::~string((string *)&encryMethod);
  return bVar6;
}

Assistant:

bool ProxyClient::start()
{
	assert(m_runStatus == RUN_STATUS::STOP);

	auto cfg = ProxyConfig::getInstance();

	std::string encryMethod = cfg->getString("encry_method");
	std::string encryKey = cfg->getString("encry_key");
	std::string localIP = cfg->getString("client_listenIP");
	std::string remoteIP = cfg->getString("remoteIP");
	uint32_t localPort = cfg->getUInt32("client_listenPort");
	uint32_t remotePort = cfg->getUInt32("svr_listenPort");
	uint32_t listenCount = cfg->getUInt32("client_listenCount", 0xFFFF);
	bool isipv6 = cfg->getBool("is_ipv6", false);
	bool useKcp = cfg->getBool("use_kcp", false);

	m_username = cfg->getString("username");
	m_password = cfg->getString("password");

	if(encryMethod == "RC4" && encryKey.empty())
		return false;

	if(localPort == 0 || remotePort == 0 || listenCount == 0 || localIP.empty() || remoteIP.empty())
		return false;

	this->m_remoteIP = remoteIP;
	this->m_remotePort = remotePort;

	m_tcpSvr = std::make_unique<TCPServer>();
	m_tcpSvr->setCloseCallback(std::bind(&ProxyClient::on_tcp_ServerCloseCall, this, std::placeholders::_1));
	m_tcpSvr->setNewConnectCallback(std::bind(&ProxyClient::on_tcp_ServerNewConnectCall, this, std::placeholders::_1, std::placeholders::_2));
	m_tcpSvr->setRecvCallback(std::bind(&ProxyClient::on_tcp_ServerRecvCall, this, std::placeholders::_1, std::placeholders::_2, std::placeholders::_3, std::placeholders::_4));
	m_tcpSvr->setDisconnectCallback(std::bind(&ProxyClient::on_tcp_ServerDisconnectCall, this, std::placeholders::_1, std::placeholders::_2));

	if (!m_tcpSvr->startServer(localIP.c_str(), localPort, isipv6, listenCount))
	{
		m_tcpSvr = NULL;
		return false;
	}

	if(encryMethod == "RC4")
		m_cypher = std::make_unique<Cypher>(EncryMethod::RC4, encryKey.c_str(), encryKey.size());
	else if(encryMethod == "SNAPPY")
		m_cypher = std::make_unique<Cypher>(EncryMethod::SNAPPY, encryKey.c_str(), encryKey.size());
	else
		m_cypher = std::make_unique<Cypher>(EncryMethod::NONE, encryKey.c_str(), encryKey.size());

	if(useKcp)
		m_pipe = std::make_unique<KCPClient>();
	else
		m_pipe = std::make_unique<TCPClient>();

	m_pipe->setClientCloseCallback([=](Client*){});
	m_pipe->setConnectCallback(std::bind(&ProxyClient::on_pipeConnectCallback, this, std::placeholders::_1, std::placeholders::_2, std::placeholders::_3));
	m_pipe->setDisconnectCallback(std::bind(&ProxyClient::on_pipeDisconnectCallback, this, std::placeholders::_1, std::placeholders::_2));
	m_pipe->setRecvCallback(std::bind(&ProxyClient::on_pipeRecvCallback, this, std::placeholders::_1, std::placeholders::_2, std::placeholders::_3, std::placeholders::_4));
	m_pipe->setRemoveSessionCallback([](Client*, Session* session) {});

	m_runStatus = RUN_STATUS::RUN;

	m_update.start(m_loop.ptr(), [](uv_timer_t* handle) 
	{
		auto self = (ProxyClient*)handle->data;
		self->updateFrame();
	}, 1, 1, this);
	m_loop.run(UV_RUN_DEFAULT);
	m_loop.close();

	if (m_stopCall != nullptr)
	{
		m_stopCall();
		m_stopCall = nullptr;
	}

	return true;
}